

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

t_float fielddesc_cvttocoord(_fielddesc *f,t_float val)

{
  float local_34;
  float local_30;
  t_float div;
  t_float extreme;
  t_float pix;
  t_float coord;
  t_float val_local;
  _fielddesc *f_local;
  
  if ((f->fd_v2 != f->fd_v1) || (f_local._4_4_ = val, NAN(f->fd_v2) || NAN(f->fd_v1))) {
    extreme = (val - f->fd_v1) * ((f->fd_screen2 - f->fd_screen1) / (f->fd_v2 - f->fd_v1)) +
              f->fd_screen1;
    if (f->fd_screen2 <= f->fd_screen1) {
      local_30 = f->fd_screen2;
    }
    else {
      local_30 = f->fd_screen1;
    }
    if (extreme < local_30) {
      extreme = local_30;
    }
    if (f->fd_screen1 < f->fd_screen2 || f->fd_screen1 == f->fd_screen2) {
      local_34 = f->fd_screen2;
    }
    else {
      local_34 = f->fd_screen1;
    }
    if (local_34 < extreme) {
      extreme = local_34;
    }
    f_local._4_4_ = extreme;
  }
  return f_local._4_4_;
}

Assistant:

t_float fielddesc_cvttocoord(t_fielddesc *f, t_float val)
{
    t_float coord, pix, extreme, div;
    if (f->fd_v2 == f->fd_v1)
        return (val);
    div = (f->fd_screen2 - f->fd_screen1)/(f->fd_v2 - f->fd_v1);
    coord = f->fd_screen1 + (val - f->fd_v1) * div;
    extreme = (f->fd_screen1 < f->fd_screen2 ?
        f->fd_screen1 : f->fd_screen2);
    if (coord < extreme)
        coord = extreme;
    extreme = (f->fd_screen1 > f->fd_screen2 ?
        f->fd_screen1 : f->fd_screen2);
    if (coord > extreme)
        coord = extreme;
    return (coord);
}